

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  add_thousands_sep<char> thousands_sep;
  char *pcVar1;
  uint uStack_c;
  
  thousands_sep.sep_.size_ = 1;
  thousands_sep.sep_.data_ = (char *)(this + 8);
  thousands_sep._16_8_ = (ulong)uStack_c << 0x20;
  pcVar1 = internal::format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
                     (*it,*(uint *)this,*(uint *)(this + 4),thousands_sep);
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }